

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GravityCompensationHelpers.cpp
# Opt level: O0

bool __thiscall
iDynTree::GravityCompensationHelper::getGravityCompensationTorques
          (GravityCompensationHelper *this,JointDOFsDoubleArray *jointTrqs)

{
  byte bVar1;
  FreeFloatingGeneralizedTorques *this_00;
  byte *in_RDI;
  LinkWrenches *pLVar2;
  bool ok;
  bool local_1;
  
  if ((*in_RDI & 1) == 0) {
    iDynTree::reportError
              ("GravityCompensationHelper","getGravityCompensationTorques","Model not set");
    local_1 = false;
  }
  else if ((in_RDI[1] & 1) == 0) {
    iDynTree::reportError
              ("GravityCompensationHelper","getGravityCompensationTorques",
               "Kinematic information not set");
    local_1 = false;
  }
  else {
    pLVar2 = (LinkWrenches *)(in_RDI + 0x238);
    this_00 = (FreeFloatingGeneralizedTorques *)(in_RDI + 0x250);
    bVar1 = iDynTree::RNEADynamicPhase
                      ((Model *)(in_RDI + 8),(Traversal *)(in_RDI + 0x138),
                       (JointPosDoubleArray *)(in_RDI + 0x1b0),(LinkVelArray *)(in_RDI + 0x1f0),
                       (LinkAccArray *)(in_RDI + 0x208),(LinkWrenches *)(in_RDI + 0x220),pLVar2,
                       this_00);
    if ((bVar1 & 1) == 0) {
      iDynTree::reportError
                ("GravityCompensationHelper","getGravityCompensationTorques",
                 "Error in computing RNEADynamicPhase");
      local_1 = false;
    }
    else {
      iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
      JointDOFsDoubleArray::operator=
                ((JointDOFsDoubleArray *)this_00,(JointDOFsDoubleArray *)pLVar2);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool GravityCompensationHelper::getGravityCompensationTorques(JointDOFsDoubleArray& jointTrqs)
  {
    if (!m_isModelValid)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Model not set");
      return false;
    }
    
    if (!m_isKinematicsUpdated)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Kinematic information not set");
      return false;
    }
    
    // Compute joint torques
    bool ok = iDynTree::RNEADynamicPhase(m_model, m_dynamicTraversal, m_jointPos, m_linkVels, m_linkProperAccs,
                                         m_linkNetExternalWrenchesZero, m_linkIntWrenches, m_generalizedTorques);
    if (!ok)
    {
      iDynTree::reportError("GravityCompensationHelper", "getGravityCompensationTorques", "Error in computing RNEADynamicPhase");
      return false;
    }
    
    // store computed torques
    jointTrqs = m_generalizedTorques.jointTorques();
    
    return true;
  }